

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

Result __thiscall wabt::WastParser::ParseValueType(WastParser *this,Var *out_type)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  bool bVar1;
  Result RVar2;
  Enum EVar3;
  char *format;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_250;
  Location local_240;
  Var local_220;
  string local_1d8;
  Type local_1b8;
  bool local_191;
  Type TStack_190;
  bool is_enabled;
  Type type;
  Token token;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_138;
  allocator<char> local_137;
  allocator<char> local_136;
  allocator<char> local_135;
  allocator<char> local_134;
  allocator<char> local_133;
  allocator<char> local_132;
  allocator<char> local_131;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  string asStack_110 [32];
  string asStack_f0 [32];
  string asStack_d0 [32];
  string asStack_b0 [32];
  string asStack_90 [32];
  string asStack_70 [32];
  iterator local_50;
  size_type local_48;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_40;
  undefined1 local_22;
  byte local_21;
  bool is_value_type;
  Var *pVStack_20;
  bool is_ref_type;
  Var *out_type_local;
  WastParser *this_local;
  
  pVStack_20 = out_type;
  out_type_local = (Var *)this;
  local_21 = PeekMatchRefType(this);
  local_22 = PeekMatch(this,First_Type,0);
  if (((bool)local_22) || ((local_21 & 1) != 0)) {
    if ((local_21 & 1) == 0) {
      Consume((Token *)&type,this);
      TStack_190 = Token::type((Token *)&type);
      EVar3 = Type::operator_cast_to_Enum(&stack0xfffffffffffffe70);
      if ((uint)(EVar3 + 0x11) < 2) {
        local_191 = Features::reference_types_enabled(&this->options_->features);
      }
      else if (EVar3 == V128) {
        local_191 = Features::simd_enabled(&this->options_->features);
      }
      else {
        local_191 = true;
      }
      if (local_191 == false) {
        local_1b8 = type;
        Type::GetName_abi_cxx11_(&local_1d8,&stack0xfffffffffffffe70);
        format = (char *)std::__cxx11::string::c_str();
        Error(this,0x244a0f,format);
        std::__cxx11::string::~string((string *)&local_1d8);
        Result::Result((Result *)((long)&this_local + 4),Error);
      }
      else {
        EVar3 = Type::operator_cast_to_Enum(&stack0xfffffffffffffe70);
        GetLocation(&local_240,this);
        Var::Var(&local_220,EVar3,&local_240);
        Var::operator=(pVStack_20,&local_220);
        Var::~Var(&local_220);
        Result::Result((Result *)((long)&this_local + 4),Ok);
      }
    }
    else {
      RVar2 = Expect(this,Lpar);
      bVar1 = Failed(RVar2);
      if (bVar1) {
        Result::Result((Result *)((long)&this_local + 4),Error);
      }
      else {
        RVar2 = Expect(this,Ref);
        bVar1 = Failed(RVar2);
        if (bVar1) {
          Result::Result((Result *)((long)&this_local + 4),Error);
        }
        else {
          RVar2 = ParseVar(this,pVStack_20);
          bVar1 = Failed(RVar2);
          if (bVar1) {
            Result::Result((Result *)((long)&this_local + 4),Error);
          }
          else {
            RVar2 = Expect(this,Rpar);
            bVar1 = Failed(RVar2);
            if (bVar1) {
              Result::Result((Result *)((long)&this_local + 4),Error);
            }
            else {
              Result::Result((Result *)((long)&this_local + 4),Ok);
            }
          }
        }
      }
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_130,"i32",&local_131);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(asStack_110,"i64",&local_132);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(asStack_f0,"f32",&local_133);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(asStack_d0,"f64",&local_134);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(asStack_b0,"v128",&local_135);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(asStack_90,"externref",&local_136);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(asStack_70,"funcref",&local_137);
    local_50 = &local_130;
    local_48 = 7;
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::allocator(&local_138);
    __l._M_len = local_48;
    __l._M_array = local_50;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_40,__l,&local_138);
    this_local._4_4_ = ErrorExpected(this,&local_40,(char *)0x0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_40);
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~allocator(&local_138);
    local_250 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_50;
    do {
      local_250 = local_250 + -1;
      std::__cxx11::string::~string((string *)local_250);
    } while (local_250 != &local_130);
    std::allocator<char>::~allocator(&local_137);
    std::allocator<char>::~allocator(&local_136);
    std::allocator<char>::~allocator(&local_135);
    std::allocator<char>::~allocator(&local_134);
    std::allocator<char>::~allocator(&local_133);
    std::allocator<char>::~allocator(&local_132);
    std::allocator<char>::~allocator(&local_131);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result WastParser::ParseValueType(Var* out_type) {
  WABT_TRACE(ParseValueType);

  const bool is_ref_type = PeekMatchRefType();
  const bool is_value_type = PeekMatch(TokenType::ValueType);

  if (!is_value_type && !is_ref_type) {
    return ErrorExpected(
        {"i32", "i64", "f32", "f64", "v128", "externref", "funcref"});
  }

  if (is_ref_type) {
    EXPECT(Lpar);
    EXPECT(Ref);
    CHECK_RESULT(ParseVar(out_type));
    EXPECT(Rpar);
    return Result::Ok;
  }

  Token token = Consume();
  Type type = token.type();
  bool is_enabled;
  switch (type) {
    case Type::V128:
      is_enabled = options_->features.simd_enabled();
      break;
    case Type::FuncRef:
    case Type::ExternRef:
      is_enabled = options_->features.reference_types_enabled();
      break;
    default:
      is_enabled = true;
      break;
  }

  if (!is_enabled) {
    Error(token.loc, "value type not allowed: %s", type.GetName().c_str());
    return Result::Error;
  }

  *out_type = Var(type, GetLocation());
  return Result::Ok;
}